

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O0

void __thiscall
polyscope::render::backend_openGL3_glfw::GLShaderProgram::~GLShaderProgram(GLShaderProgram *this)

{
  undefined8 *in_RDI;
  vector<polyscope::render::backend_openGL3_glfw::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderAttribute>_>
  *unaff_retaddr;
  
  *in_RDI = &PTR__GLShaderProgram_0098f4d0;
  (*glad_glDeleteVertexArrays)(1,(GLuint *)(in_RDI + 0x13));
  std::shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram>::~shared_ptr
            ((shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram> *)0x4eb33c);
  std::
  vector<polyscope::render::backend_openGL3_glfw::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderTexture>_>
  ::~vector((vector<polyscope::render::backend_openGL3_glfw::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderTexture>_>
             *)unaff_retaddr);
  std::
  vector<polyscope::render::backend_openGL3_glfw::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderAttribute>_>
  ::~vector(unaff_retaddr);
  std::
  vector<polyscope::render::backend_openGL3_glfw::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderUniform>_>
  ::~vector((vector<polyscope::render::backend_openGL3_glfw::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderUniform>_>
             *)unaff_retaddr);
  ShaderProgram::~ShaderProgram((ShaderProgram *)0x4eb370);
  return;
}

Assistant:

GLShaderProgram::~GLShaderProgram() { glDeleteVertexArrays(1, &vaoHandle); }